

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_truncated_filter.c
# Opt level: O0

void test_truncation(char *compression,_func_int_archive_ptr *set_compression,int can_prog)

{
  int iVar1;
  uint uVar2;
  wchar_t wVar3;
  int iVar4;
  void *__ptr;
  void *__s;
  long v1;
  int in_EDX;
  code *in_RSI;
  undefined8 in_RDI;
  int use_prog;
  int r;
  int j;
  int i;
  size_t used1;
  size_t datasize;
  size_t buffsize;
  char *data;
  char *buff;
  char path [16];
  archive *a;
  archive_entry *ae;
  void *in_stack_ffffffffffffff58;
  archive *paVar5;
  archive_entry *paVar6;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  archive *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  archive *in_stack_ffffffffffffff78;
  archive *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar7;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  uint uVar8;
  void *in_stack_ffffffffffffffa0;
  archive *__n;
  char local_38 [16];
  archive_entry *local_28;
  archive_entry *local_20;
  int local_14;
  code *local_10;
  undefined8 local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  __ptr = malloc(2000000);
  assertion_assert(in_stack_ffffffffffffff70,(wchar_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff68,
                   (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58);
  if (__ptr != (void *)0x0) {
    __n = (archive *)0x2710;
    __s = malloc(10000);
    assertion_assert(in_stack_ffffffffffffff70,(wchar_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                     (wchar_t)in_stack_ffffffffffffff68,
                     (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58);
    if (__s == (void *)0x0) {
      free(__ptr);
    }
    else {
      memset(__s,0,(size_t)__n);
      local_28 = (archive_entry *)archive_write_new();
      assertion_assert(in_stack_ffffffffffffff70,(wchar_t)((ulong)in_stack_ffffffffffffff68 >> 0x20)
                       ,(wchar_t)in_stack_ffffffffffffff68,
                       (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
      archive_write_set_format_ustar(in_stack_ffffffffffffff68);
      assertion_equal_int((char *)in_stack_ffffffffffffff78,
                          (wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                          (longlong)in_stack_ffffffffffffff68,
                          (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          (longlong)local_28,(char *)0x1c8b42,
                          (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      archive_write_add_filter_compress(in_stack_ffffffffffffff68);
      assertion_equal_int((char *)in_stack_ffffffffffffff78,
                          (wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                          (longlong)in_stack_ffffffffffffff68,
                          (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          (longlong)local_28,(char *)0x1c8b81,
                          (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      iVar1 = (*local_10)(local_28);
      if ((iVar1 == 0) || (local_14 != 0)) {
        uVar7 = iVar1 == -0x14 && local_14 != 0;
        uVar2 = (uint)(byte)uVar7;
        archive_write_set_bytes_per_block(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
        assertion_equal_int((char *)in_stack_ffffffffffffff78,
                            (wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                            (longlong)in_stack_ffffffffffffff68,
                            (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (longlong)local_28,(char *)0x1c8c94,(void *)CONCAT44(iVar1,uVar2));
        archive_write_open_memory
                  (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                   (size_t)in_stack_ffffffffffffff68,
                   (size_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        paVar6 = local_28;
        assertion_equal_int((char *)in_stack_ffffffffffffff78,
                            (wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                            (longlong)in_stack_ffffffffffffff68,
                            (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (longlong)local_28,(char *)0x1c8ce2,(void *)CONCAT44(iVar1,uVar2));
        local_20 = archive_entry_new();
        assertion_assert(in_stack_ffffffffffffff70,
                         (wchar_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                         (wchar_t)in_stack_ffffffffffffff68,
                         (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         paVar6);
        archive_entry_set_filetype(local_20,0x8000);
        archive_entry_set_size(local_20,(int64_t)__n);
        for (uVar8 = 0; (int)uVar8 < 100; uVar8 = uVar8 + 1) {
          sprintf(local_38,"%s%d",local_8,(ulong)uVar8);
          archive_entry_copy_pathname
                    ((archive_entry *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     (char *)paVar6);
          failure(local_38);
          archive_write_header
                    ((archive *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),paVar6
                    );
          paVar6 = local_28;
          wVar3 = assertion_equal_int((char *)in_stack_ffffffffffffff78,
                                      (wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                                      (longlong)in_stack_ffffffffffffff68,
                                      (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                       in_stack_ffffffffffffff60),(longlong)local_28
                                      ,(char *)0x1c8dd3,(void *)CONCAT44(iVar1,uVar2));
          if (wVar3 == L'\0') {
            archive_write_free((archive *)0x1c8de5);
            free(__s);
            free(__ptr);
            return;
          }
          in_stack_ffffffffffffff80 = __n;
          for (in_stack_ffffffffffffff98 = 0;
              in_stack_ffffffffffffff98 < (int)in_stack_ffffffffffffff80;
              in_stack_ffffffffffffff98 = in_stack_ffffffffffffff98 + 1) {
            iVar4 = rand();
            *(char *)((long)__s + (long)in_stack_ffffffffffffff98) = (char)((long)iVar4 % 0x100);
          }
          failure(local_38);
          __n = in_stack_ffffffffffffff80;
          archive_write_data((archive *)
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),paVar6,
                             0x1c8e67);
          paVar6 = local_28;
          wVar3 = assertion_equal_int((char *)in_stack_ffffffffffffff78,
                                      (wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                                      (longlong)in_stack_ffffffffffffff68,
                                      (char *)CONCAT44(in_stack_ffffffffffffff64,
                                                       in_stack_ffffffffffffff60),(longlong)local_28
                                      ,(char *)0x1c8e9a,(void *)CONCAT44(iVar1,uVar2));
          if (wVar3 == L'\0') {
            archive_write_free((archive *)0x1c8eac);
            free(__s);
            free(__ptr);
            return;
          }
        }
        archive_entry_free((archive_entry *)0x1c8ee4);
        archive_write_close((archive *)0x1c8ef1);
        assertion_equal_int((char *)in_stack_ffffffffffffff78,
                            (wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                            (longlong)in_stack_ffffffffffffff68,
                            (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (longlong)local_28,(char *)0x1c8f23,(void *)CONCAT44(iVar1,uVar2));
        archive_write_free((archive *)0x1c8f30);
        paVar5 = (archive *)0x0;
        assertion_equal_int((char *)in_stack_ffffffffffffff78,
                            (wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                            (longlong)in_stack_ffffffffffffff68,
                            (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),0,
                            (char *)0x1c8f5e,(void *)CONCAT44(iVar1,uVar2));
        local_28 = (archive_entry *)archive_read_new();
        assertion_assert(in_stack_ffffffffffffff70,
                         (wchar_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                         (wchar_t)in_stack_ffffffffffffff68,
                         (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         paVar5);
        archive_read_support_format_all(paVar5);
        paVar6 = local_28;
        assertion_equal_int((char *)in_stack_ffffffffffffff78,
                            (wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                            (longlong)in_stack_ffffffffffffff68,
                            (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (longlong)local_28,(char *)0x1c8fd3,(void *)CONCAT44(iVar1,uVar2));
        archive_read_support_filter_all((archive *)paVar6);
        paVar6 = local_28;
        assertion_equal_int((char *)in_stack_ffffffffffffff78,
                            (wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                            (longlong)in_stack_ffffffffffffff68,
                            (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (longlong)local_28,(char *)0x1c9012,(void *)CONCAT44(iVar1,uVar2));
        archive_read_open_memory
                  ((archive *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),paVar6,
                   0x1c9035);
        paVar6 = local_28;
        assertion_equal_int((char *)in_stack_ffffffffffffff78,
                            (wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                            (longlong)in_stack_ffffffffffffff68,
                            (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (longlong)local_28,(char *)0x1c9067,(void *)CONCAT44(iVar1,uVar2));
        for (uVar8 = 0; (int)uVar8 < 100; uVar8 = uVar8 + 1) {
          iVar4 = archive_read_next_header
                            ((archive *)
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             (archive_entry **)paVar6);
          if (iVar4 != 0) {
            failure("Should have non-NULL error message for %s",local_8);
            archive_error_string((archive *)local_28);
            assertion_assert(in_stack_ffffffffffffff70,
                             (wchar_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                             (wchar_t)in_stack_ffffffffffffff68,
                             (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             paVar6);
            break;
          }
          sprintf(local_38,"%s%d",local_8,(ulong)uVar8);
          in_stack_ffffffffffffff70 = local_38;
          archive_entry_pathname(paVar6);
          paVar6 = (archive_entry *)0x0;
          in_stack_ffffffffffffff60 = 0;
          assertion_equal_string
                    ((char *)CONCAT17(uVar7,in_stack_ffffffffffffff88),
                     (wchar_t)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                     (char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                     (char *)in_stack_ffffffffffffff68,
                     (char *)((ulong)in_stack_ffffffffffffff64 << 0x20),in_stack_ffffffffffffffa0,
                     (wchar_t)__n);
          in_stack_ffffffffffffff78 = __n;
          __n = in_stack_ffffffffffffff78;
          paVar5 = (archive *)
                   archive_read_data((archive *)CONCAT44(uVar8,in_stack_ffffffffffffff98),
                                     (void *)CONCAT44(iVar1,uVar2),
                                     CONCAT17(uVar7,in_stack_ffffffffffffff88));
          if (in_stack_ffffffffffffff78 != paVar5) {
            failure("Should have non-NULL error message for %s",local_8);
            archive_error_string((archive *)local_28);
            assertion_assert(in_stack_ffffffffffffff70,
                             (wchar_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                             (wchar_t)in_stack_ffffffffffffff68,
                             (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             paVar6);
            break;
          }
        }
        wVar3 = (wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20);
        iVar4 = 0;
        if (uVar2 != 0) {
          iVar4 = -0x14;
        }
        v1 = (long)iVar4;
        archive_read_close((archive *)0x1c9214);
        assertion_equal_int((char *)in_stack_ffffffffffffff78,wVar3,v1,
                            (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (longlong)local_28,(char *)0x1c9247,(void *)CONCAT44(iVar1,uVar2));
        archive_read_free((archive *)0x1c9254);
        assertion_equal_int((char *)in_stack_ffffffffffffff78,wVar3,v1,
                            (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),0,
                            (char *)0x1c9282,(void *)CONCAT44(iVar1,uVar2));
        free(__s);
        free(__ptr);
      }
      else {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_truncated_filter.c"
                       ,L'D');
        wVar3 = (wchar_t)((ulong)in_stack_ffffffffffffff70 >> 0x20);
        test_skipping("%s writing not supported on this platform",local_8);
        archive_write_free((archive *)0x1c8be0);
        assertion_equal_int((char *)in_stack_ffffffffffffff78,wVar3,
                            (longlong)in_stack_ffffffffffffff68,
                            (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),0,
                            (char *)0x1c8c0e,(void *)CONCAT44(iVar1,in_stack_ffffffffffffff90));
        free(__ptr);
        free(__s);
      }
    }
  }
  return;
}

Assistant:

static void
test_truncation(const char *compression,
    int (*set_compression)(struct archive *), int can_prog)
{
	struct archive_entry *ae;
	struct archive* a;
	char path[16];
	char *buff, *data;
	size_t buffsize, datasize, used1;
	int i, j, r, use_prog;

	buffsize = 2000000;
	assert(NULL != (buff = (char *)malloc(buffsize)));
	if (buff == NULL)
		return;

	datasize = 10000;
	assert(NULL != (data = (char *)malloc(datasize)));
	if (data == NULL) {
		free(buff);
		return;
	}
	memset(data, 0, datasize);

	/*
	 * Write a bunch of files with semi-random data.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_add_filter_compress(a));
	r = (*set_compression)(a);
	if (r != ARCHIVE_OK && !can_prog) {
		skipping("%s writing not supported on this platform",
		    compression);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		free(data);
		return;
	}
	use_prog = (r == ARCHIVE_WARN && can_prog);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used1));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		sprintf(path, "%s%d", compression, i);
		archive_entry_copy_pathname(ae, path);
		failure(path);
		if (!assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_header(a, ae))) {
			archive_write_free(a);
			free(data);
			free(buff);
			return;
		}
		for (j = 0; j < (int)datasize; ++j) {
			data[j] = (char)(rand() % 256);
		}
		failure(path);
		if (!assertEqualIntA(a, datasize,
		    archive_write_data(a, data, datasize))) {
			archive_write_free(a);
			free(data);
			free(buff);
			return;
		}
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));

	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, buff, used1 - used1/64));
	for (i = 0; i < 100; i++) {
		if (ARCHIVE_OK != archive_read_next_header(a, &ae)) {
			failure("Should have non-NULL error message for %s",
			    compression);
			assert(NULL != archive_error_string(a));
			break;
		}
		sprintf(path, "%s%d", compression, i);
		assertEqualString(path, archive_entry_pathname(ae));
		if (datasize != (size_t)archive_read_data(a, data, datasize)) {
			failure("Should have non-NULL error message for %s",
			    compression);
			assert(NULL != archive_error_string(a));
			break;
		}
	}
	assertEqualIntA(a, (use_prog)?ARCHIVE_WARN:ARCHIVE_OK,
	    archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	free(data);
	free(buff);
}